

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_exporter.cpp
# Opt level: O2

void Assimp::Write(JSONWriter *out,aiCamera *ai,bool is_elem)

{
  allocator local_31;
  string local_30;
  
  JSONWriter::StartObj(out,is_elem);
  std::__cxx11::string::string((string *)&local_30,"name",&local_31);
  JSONWriter::Key(out,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  JSONWriter::SimpleValue<aiString>(out,&ai->mName);
  std::__cxx11::string::string((string *)&local_30,"aspect",&local_31);
  JSONWriter::Key(out,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  JSONWriter::SimpleValue<float>(out,&ai->mAspect);
  std::__cxx11::string::string((string *)&local_30,"clipplanefar",&local_31);
  JSONWriter::Key(out,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  JSONWriter::SimpleValue<float>(out,&ai->mClipPlaneFar);
  std::__cxx11::string::string((string *)&local_30,"clipplanenear",&local_31);
  JSONWriter::Key(out,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  JSONWriter::SimpleValue<float>(out,&ai->mClipPlaneNear);
  std::__cxx11::string::string((string *)&local_30,"horizontalfov",&local_31);
  JSONWriter::Key(out,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  JSONWriter::SimpleValue<float>(out,&ai->mHorizontalFOV);
  std::__cxx11::string::string((string *)&local_30,"up",&local_31);
  JSONWriter::Key(out,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  Write(out,&ai->mUp,false);
  std::__cxx11::string::string((string *)&local_30,"lookat",&local_31);
  JSONWriter::Key(out,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  Write(out,&ai->mLookAt,false);
  JSONWriter::EndObj(out);
  return;
}

Assistant:

void Write(JSONWriter& out, const aiCamera& ai, bool is_elem = true) {
    out.StartObj(is_elem);

    out.Key("name");
    out.SimpleValue(ai.mName);

    out.Key("aspect");
    out.SimpleValue(ai.mAspect);

    out.Key("clipplanefar");
    out.SimpleValue(ai.mClipPlaneFar);

    out.Key("clipplanenear");
    out.SimpleValue(ai.mClipPlaneNear);

    out.Key("horizontalfov");
    out.SimpleValue(ai.mHorizontalFOV);

    out.Key("up");
    Write(out, ai.mUp, false);

    out.Key("lookat");
    Write(out, ai.mLookAt, false);

    out.EndObj();
}